

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

size_t __thiscall arm::ConstValue::size(ConstValue *this)

{
  bool bVar1;
  add_pointer_t<unsigned_int> ptVar2;
  add_pointer_t<std::vector<unsigned_int>_> this_00;
  int *piVar3;
  add_pointer_t<std::__cxx11::basic_string<char>_> ptVar4;
  logic_error *this_01;
  add_pointer_t<std::__cxx11::basic_string<char>_> x_2;
  add_pointer_t<std::vector<unsigned_int>_> x_1;
  add_pointer_t<unsigned_int> x;
  size_type local_8;
  
  ptVar2 = std::
           get_if<unsigned_int,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::__cxx11::string>
                     ((variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x2c5dbc);
  if (ptVar2 == (add_pointer_t<unsigned_int>)0x0) {
    this_00 = std::
              get_if<std::vector<unsigned_int,std::allocator<unsigned_int>>,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::__cxx11::string>
                        ((variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)0x2c5de5);
    if (this_00 == (add_pointer_t<std::vector<unsigned_int>_>)0x0) {
      ptVar4 = std::
               get_if<std::__cxx11::string,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::__cxx11::string>
                         ((variant<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)0x2c5e40);
      if (ptVar4 == (add_pointer_t<std::__cxx11::basic_string<char>_>)0x0) {
        this_01 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_01,"No such variant");
        __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      local_8 = std::__cxx11::string::size();
    }
    else {
      bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0x2c5e00);
      if (bVar1) {
        piVar3 = std::optional<int>::operator*((optional<int> *)0x2c5e14);
        local_8 = (size_type)*piVar3;
      }
      else {
        local_8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
      }
    }
  }
  else {
    local_8 = 4;
  }
  return local_8;
}

Assistant:

size_t ConstValue::size() {
  if (auto x = std::get_if<uint32_t>(this)) {
    return 4;
  } else if (auto x = std::get_if<std::vector<uint32_t>>(this)) {
    if (len) {
      return *len;
    } else {
      return x->size();
    }
  } else if (auto x = std::get_if<std::string>(this)) {
    return x->size();
  } else {
    throw std::logic_error("No such variant");
  }
}